

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O2

bool __thiscall
S2::GetIntersectionStableSorted<long_double>
          (S2 *this,Vector3<long_double> *a0,Vector3<long_double> *a1,Vector3<long_double> *b0,
          Vector3<long_double> *b1,Vector3<long_double> *result)

{
  S2 *this_00;
  BasicVector<Vector3,_long_double,_3UL> *this_01;
  longdouble in_ST0;
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble in_ST1;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST2;
  FloatType local_128;
  longdouble local_118;
  longdouble local_108;
  Vector3<long_double> *local_f0;
  longdouble local_e4;
  longdouble local_d8;
  longdouble local_cc;
  longdouble local_c0;
  longdouble local_b4;
  Vector3<long_double> local_a8;
  undefined1 local_78 [16];
  Vector3<long_double> a_norm;
  
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)a0,(D *)this);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((BasicVector<Vector3,_long_double,_3UL> *)&a_norm);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)b0,a1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((BasicVector<Vector3,_long_double,_3UL> *)&local_128);
  if (in_ST0 < in_ST1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crossings.cc"
               ,0xfe,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)CONCAT62(local_a8.c_[0]._10_6_,local_a8.c_[0]._8_2_),
                    "Check failed: ((a1 - a0).Norm2()) >= ((b1 - b0).Norm2()) ");
    abort();
  }
  local_f0 = b1;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)this,a0);
  this_00 = this;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((BasicVector<Vector3,_long_double,_3UL> *)this,a0);
  a_norm.c_[0]._0_10_ = local_118 * local_a8.c_[2]._0_10_ - local_108 * local_a8.c_[1]._0_10_;
  a_norm.c_[1]._0_10_ =
       local_108 * (longdouble)CONCAT28(local_a8.c_[0]._8_2_,local_a8.c_[0]._0_8_) -
       local_a8.c_[2]._0_10_ * local_128._0_10_;
  a_norm.c_[2]._0_10_ =
       local_a8.c_[1]._0_10_ * local_128._0_10_ -
       (longdouble)CONCAT28(local_a8.c_[0]._8_2_,local_a8.c_[0]._0_8_) * local_118;
  lVar1 = in_ST2;
  lVar4 = in_ST2;
  lVar3 = in_ST2;
  lVar2 = in_ST2;
  lVar5 = in_ST2;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            (a_norm.c_,(BasicVector<Vector3,_long_double,_3UL> *)this_00);
  this_01 = (BasicVector<Vector3,_long_double,_3UL> *)b0;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)b0,a1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm(&local_128,this_01);
  local_b4 = lVar1;
  GetProjection<long_double>
            ((longdouble *)a1,&a_norm,(Vector3<long_double> *)this,in_ST2,a0,&local_a8,
             (longdouble *)result);
  GetProjection<long_double>
            ((longdouble *)b0,&a_norm,(Vector3<long_double> *)this,in_ST2,a0,
             (Vector3<long_double> *)local_78,(longdouble *)result);
  lVar1 = ABS(lVar4 - lVar3);
  local_d8 = (longdouble)CONCAT28(local_a8.c_[0]._8_2_,local_a8.c_[0]._0_8_);
  local_cc = local_d8 + (longdouble)local_78._0_10_;
  if (local_cc < lVar1) {
    local_e4 = (longdouble)local_78._0_10_;
    local_128._0_10_ = *(longdouble *)b0->c_ * lVar4 - *(longdouble *)a1->c_ * lVar3;
    local_118 = *(longdouble *)(b0->c_ + 1) * lVar4 - *(longdouble *)(a1->c_ + 1) * lVar3;
    local_108 = *(longdouble *)(b0->c_ + 2) * lVar4 - *(longdouble *)(a1->c_ + 2) * lVar3;
    local_c0 = lVar3;
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
              ((BasicVector<Vector3,_long_double,_3UL> *)&local_128);
    if ((_DAT_002a9c70 <= lVar2) &&
       (lVar4 = local_e4 * lVar4, lVar3 = lVar1 - local_cc, sqrtl(),
       lVar1 * (longdouble)1.0842022e-19 + (local_b4 * ABS(lVar4 - local_d8 * local_c0)) / lVar3 <=
       lVar5 * (longdouble)8.881242e-16)) {
      lVar5 = (longdouble)1 / lVar5;
      *(longdouble *)local_f0->c_ = local_128._0_10_ * lVar5;
      *(longdouble *)(local_f0->c_ + 1) = local_118 * lVar5;
      *(longdouble *)(local_f0->c_ + 2) = local_108 * lVar5;
      return true;
    }
  }
  return false;
}

Assistant:

static bool GetIntersectionStableSorted(
    const Vector3<T>& a0, const Vector3<T>& a1,
    const Vector3<T>& b0, const Vector3<T>& b1, Vector3<T>* result) {
  S2_DCHECK_GE((a1 - a0).Norm2(), (b1 - b0).Norm2());

  // Compute the normal of the plane through (a0, a1) in a stable way.
  Vector3<T> a_norm = (a0 - a1).CrossProd(a0 + a1);
  T a_norm_len = a_norm.Norm();
  T b_len = (b1 - b0).Norm();

  // Compute the projection (i.e., signed distance) of b0 and b1 onto the
  // plane through (a0, a1).  Distances are scaled by the length of a_norm.
  T b0_error, b1_error;
  T b0_dist = GetProjection(b0, a_norm, a_norm_len, a0, a1, &b0_error);
  T b1_dist = GetProjection(b1, a_norm, a_norm_len, a0, a1, &b1_error);

  // The total distance from b0 to b1 measured perpendicularly to (a0,a1) is
  // |b0_dist - b1_dist|.  Note that b0_dist and b1_dist generally have
  // opposite signs because b0 and b1 are on opposite sides of (a0, a1).  The
  // code below finds the intersection point by interpolating along the edge
  // (b0, b1) to a fractional distance of b0_dist / (b0_dist - b1_dist).
  //
  // It can be shown that the maximum error in the interpolation fraction is
  //
  //     (b0_dist * b1_error - b1_dist * b0_error) /
  //        (dist_sum * (dist_sum - error_sum))
  //
  // We save ourselves some work by scaling the result and the error bound by
  // "dist_sum", since the result is normalized to be unit length anyway.
  T dist_sum = fabs(b0_dist - b1_dist);
  T error_sum = b0_error + b1_error;
  if (dist_sum <= error_sum) {
    return false;  // Error is unbounded in this case.
  }
  Vector3<T> x = b0_dist * b1 - b1_dist * b0;
  constexpr T T_ERR = s2pred::rounding_epsilon<T>();
  T error = b_len * fabs(b0_dist * b1_error - b1_dist * b0_error) /
      (dist_sum - error_sum) + 2 * T_ERR * dist_sum;

  // Finally we normalize the result, compute the corresponding error, and
  // check whether the total error is acceptable.
  T x_len2 = x.Norm2();
  if (x_len2 < std::numeric_limits<T>::min()) {
    // If x.Norm2() is less than the minimum normalized value of T, x_len might
    // lose precision and the result might fail to satisfy S2::IsUnitLength().
    // TODO(ericv): Implement S2::RobustNormalize().
    return false;
  }
  T x_len = sqrt(x_len2);
  const T kMaxError = kIntersectionError.radians();
  if (error > (kMaxError - T_ERR) * x_len) {
    return false;
  }
  *result = (1 / x_len) * x;
  return true;
}